

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O3

Aig_Obj_t * Aig_ObjRecognizeMux(Aig_Obj_t *pNode,Aig_Obj_t **ppNodeT,Aig_Obj_t **ppNodeE)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong *puVar11;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigUtil.c"
                  ,0x186,"Aig_Obj_t *Aig_ObjRecognizeMux(Aig_Obj_t *, Aig_Obj_t **, Aig_Obj_t **)");
  }
  iVar5 = Aig_ObjIsMuxType(pNode);
  if (iVar5 != 0) {
    uVar7 = (ulong)pNode->pFanin0 & 0xfffffffffffffffe;
    uVar9 = (ulong)pNode->pFanin1 & 0xfffffffffffffffe;
    puVar1 = (ulong *)(uVar7 + 0x10);
    uVar2 = *(ulong *)(uVar7 + 0x10);
    puVar11 = (ulong *)(uVar9 + 0x10);
    uVar3 = *(ulong *)(uVar9 + 0x10);
    puVar6 = puVar1;
    if (((uVar2 & 0xfffffffffffffffe) == (uVar3 & 0xfffffffffffffffe)) &&
       (((uint)uVar2 & 1) != ((uint)uVar3 & 1))) {
      if ((uVar2 & 1) == 0) {
        *ppNodeT = (Aig_Obj_t *)(*(ulong *)(uVar7 + 8) ^ 1);
        puVar11 = (ulong *)(uVar9 + 8);
      }
      else {
        *ppNodeT = (Aig_Obj_t *)(*(ulong *)(uVar9 + 8) ^ 1);
        puVar6 = puVar11;
        puVar11 = (ulong *)(uVar7 + 8);
      }
    }
    else {
      uVar4 = *(ulong *)(uVar7 + 8);
      puVar8 = (ulong *)(uVar7 + 8);
      uVar7 = *(ulong *)(uVar9 + 8);
      puVar10 = (ulong *)(uVar9 + 8);
      if (((uVar4 & 0xfffffffffffffffe) == (uVar7 & 0xfffffffffffffffe)) &&
         (((uint)uVar4 & 1) != ((uint)uVar7 & 1))) {
        if ((uVar4 & 1) == 0) {
          *ppNodeT = (Aig_Obj_t *)(uVar2 ^ 1);
          puVar6 = puVar8;
        }
        else {
          *ppNodeT = (Aig_Obj_t *)(uVar3 ^ 1);
          puVar6 = puVar10;
          puVar11 = puVar1;
        }
      }
      else if (((uVar4 & 0xfffffffffffffffe) == (uVar3 & 0xfffffffffffffffe)) &&
              (((uint)uVar4 & 1) != ((uint)uVar3 & 1))) {
        if ((uVar4 & 1) == 0) {
          *ppNodeT = (Aig_Obj_t *)(uVar2 ^ 1);
          puVar6 = puVar8;
          puVar11 = puVar10;
        }
        else {
          *ppNodeT = (Aig_Obj_t *)(uVar7 ^ 1);
          puVar6 = puVar11;
          puVar11 = puVar1;
        }
      }
      else {
        if (((uVar2 & 0xfffffffffffffffe) != (uVar7 & 0xfffffffffffffffe)) ||
           (((uint)uVar2 & 1) == ((uint)uVar7 & 1))) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigUtil.c"
                        ,0x1cd,
                        "Aig_Obj_t *Aig_ObjRecognizeMux(Aig_Obj_t *, Aig_Obj_t **, Aig_Obj_t **)");
        }
        if ((uVar2 & 1) == 0) {
          *ppNodeT = (Aig_Obj_t *)(uVar4 ^ 1);
        }
        else {
          *ppNodeT = (Aig_Obj_t *)(uVar3 ^ 1);
          puVar6 = puVar10;
          puVar11 = puVar8;
        }
      }
    }
    *ppNodeE = (Aig_Obj_t *)(*puVar11 ^ 1);
    return (Aig_Obj_t *)*puVar6;
  }
  __assert_fail("Aig_ObjIsMuxType(pNode)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigUtil.c"
                ,0x187,"Aig_Obj_t *Aig_ObjRecognizeMux(Aig_Obj_t *, Aig_Obj_t **, Aig_Obj_t **)");
}

Assistant:

Aig_Obj_t * Aig_ObjRecognizeMux( Aig_Obj_t * pNode, Aig_Obj_t ** ppNodeT, Aig_Obj_t ** ppNodeE )
{
    Aig_Obj_t * pNode0, * pNode1;
    assert( !Aig_IsComplement(pNode) );
    assert( Aig_ObjIsMuxType(pNode) );
    // get children
    pNode0 = Aig_ObjFanin0(pNode);
    pNode1 = Aig_ObjFanin1(pNode);

    // find the control variable
    if ( Aig_ObjFanin1(pNode0) == Aig_ObjFanin1(pNode1) && (Aig_ObjFaninC1(pNode0) ^ Aig_ObjFaninC1(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p2) )
        if ( Aig_ObjFaninC1(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Aig_Not(Aig_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Aig_Not(Aig_ObjChild0(pNode0));//pNode1->p1);
            return Aig_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Aig_Not(Aig_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Aig_Not(Aig_ObjChild0(pNode1));//pNode2->p1);
            return Aig_ObjChild1(pNode0);//pNode1->p2;
        }
    }
    else if ( Aig_ObjFanin0(pNode0) == Aig_ObjFanin0(pNode1) && (Aig_ObjFaninC0(pNode0) ^ Aig_ObjFaninC0(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p1) )
        if ( Aig_ObjFaninC0(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Aig_Not(Aig_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Aig_Not(Aig_ObjChild1(pNode0));//pNode1->p2);
            return Aig_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Aig_Not(Aig_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Aig_Not(Aig_ObjChild1(pNode1));//pNode2->p2);
            return Aig_ObjChild0(pNode0);//pNode1->p1;
        }
    }
    else if ( Aig_ObjFanin0(pNode0) == Aig_ObjFanin1(pNode1) && (Aig_ObjFaninC0(pNode0) ^ Aig_ObjFaninC1(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p1) )
        if ( Aig_ObjFaninC0(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Aig_Not(Aig_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Aig_Not(Aig_ObjChild1(pNode0));//pNode1->p2);
            return Aig_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Aig_Not(Aig_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Aig_Not(Aig_ObjChild0(pNode1));//pNode2->p1);
            return Aig_ObjChild0(pNode0);//pNode1->p1;
        }
    }
    else if ( Aig_ObjFanin1(pNode0) == Aig_ObjFanin0(pNode1) && (Aig_ObjFaninC1(pNode0) ^ Aig_ObjFaninC0(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p2) )
        if ( Aig_ObjFaninC1(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Aig_Not(Aig_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Aig_Not(Aig_ObjChild0(pNode0));//pNode1->p1);
            return Aig_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Aig_Not(Aig_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Aig_Not(Aig_ObjChild1(pNode1));//pNode2->p2);
            return Aig_ObjChild1(pNode0);//pNode1->p2;
        }
    }
    assert( 0 ); // this is not MUX
    return NULL;
}